

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O0

void storerequest(char *reqbuf,size_t totalsize)

{
  int iVar1;
  FILE *__s;
  uint *puVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  FILE *dump;
  size_t writeleft;
  size_t written;
  int error;
  int res;
  size_t totalsize_local;
  char *reqbuf_local;
  
  written._0_4_ = 0;
  if ((reqbuf != (char *)0x0) && (totalsize != 0)) {
    do {
      __s = fopen64("log/server.input","ab");
      bVar5 = false;
      if (__s == (FILE *)0x0) {
        puVar2 = (uint *)__errno_location();
        written._0_4_ = *puVar2;
        bVar5 = (uint)written == 4;
      }
    } while (bVar5);
    dump = (FILE *)totalsize;
    if (__s == (FILE *)0x0) {
      pcVar3 = strerror((uint)written);
      logmsg("Error opening file %s error: %d %s","log/server.input",(ulong)(uint)written,pcVar3);
      logmsg("Failed to write request input to log/server.input");
    }
    else {
      do {
        sVar4 = fwrite(reqbuf + (totalsize - (long)dump),1,(size_t)dump,__s);
        if (got_exit_signal != 0) goto LAB_00108d7e;
        if (sVar4 != 0) {
          dump = (FILE *)((long)dump - sVar4);
        }
        bVar5 = false;
        if (dump != (FILE *)0x0) {
          puVar2 = (uint *)__errno_location();
          written._0_4_ = *puVar2;
          bVar5 = (uint)written == 4;
        }
      } while (bVar5);
      if (dump == (FILE *)0x0) {
        logmsg("Wrote request (%zu bytes) input to log/server.input",totalsize);
      }
      else if (dump != (FILE *)0x0) {
        pcVar3 = strerror((uint)written);
        logmsg("Error writing file %s error: %d %s","log/server.input",(ulong)(uint)written,pcVar3);
        logmsg("Wrote only (%zu bytes) of (%zu bytes) request input to %s",totalsize - (long)dump,
               totalsize,"log/server.input");
      }
LAB_00108d7e:
      do {
        iVar1 = fclose(__s);
        bVar5 = false;
        if (iVar1 != 0) {
          puVar2 = (uint *)__errno_location();
          written._0_4_ = *puVar2;
          bVar5 = (uint)written == 4;
        }
      } while (bVar5);
      if (iVar1 != 0) {
        pcVar3 = strerror((uint)written);
        logmsg("Error closing file %s error: %d %s","log/server.input",(ulong)(uint)written,pcVar3);
      }
    }
  }
  return;
}

Assistant:

static void storerequest(char *reqbuf, size_t totalsize)
{
  int res;
  int error = 0;
  size_t written;
  size_t writeleft;
  FILE *dump;

  if(reqbuf == NULL)
    return;
  if(totalsize == 0)
    return;

  do {
    dump = fopen(REQUEST_DUMP, "ab");
  } while((dump == NULL) && ((error = errno) == EINTR));
  if(dump == NULL) {
    logmsg("Error opening file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
    logmsg("Failed to write request input to " REQUEST_DUMP);
    return;
  }

  writeleft = totalsize;
  do {
    written = fwrite(&reqbuf[totalsize-writeleft],
                     1, writeleft, dump);
    if(got_exit_signal)
      goto storerequest_cleanup;
    if(written > 0)
      writeleft -= written;
  } while((writeleft > 0) && ((error = errno) == EINTR));

  if(writeleft == 0)
    logmsg("Wrote request (%zu bytes) input to " REQUEST_DUMP, totalsize);
  else if(writeleft > 0) {
    logmsg("Error writing file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
    logmsg("Wrote only (%zu bytes) of (%zu bytes) request input to %s",
           totalsize-writeleft, totalsize, REQUEST_DUMP);
  }

storerequest_cleanup:

  do {
    res = fclose(dump);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing file %s error: %d %s",
           REQUEST_DUMP, error, strerror(error));
}